

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_readlink(uv_fs_t *req)

{
  size_t size;
  char *__buf;
  int *piVar1;
  size_t sVar2;
  char *newbuf;
  char *buf;
  ssize_t len;
  ssize_t maxlen;
  uv_fs_t *req_local;
  
  size = uv__fs_pathmax_size(req->path);
  __buf = (char *)uv__malloc(size);
  if (__buf == (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
    req_local = (uv_fs_t *)0xffffffffffffffff;
  }
  else {
    sVar2 = readlink(req->path,__buf,size);
    if (sVar2 == 0xffffffffffffffff) {
      uv__free(__buf);
      req_local = (uv_fs_t *)0xffffffffffffffff;
    }
    else {
      newbuf = __buf;
      if ((sVar2 == size) && (newbuf = (char *)uv__realloc(__buf,sVar2 + 1), newbuf == (char *)0x0))
      {
        uv__free(__buf);
        req_local = (uv_fs_t *)0xffffffffffffffff;
      }
      else {
        newbuf[sVar2] = '\0';
        req->ptr = newbuf;
        req_local = (uv_fs_t *)0x0;
      }
    }
  }
  return (ssize_t)req_local;
}

Assistant:

static ssize_t uv__fs_readlink(uv_fs_t* req) {
  ssize_t maxlen;
  ssize_t len;
  char* buf;
  char* newbuf;

#if defined(UV__FS_PATH_MAX_FALLBACK)
  /* We may not have a real PATH_MAX.  Read size of link.  */
  struct stat st;
  int ret;
  ret = lstat(req->path, &st);
  if (ret != 0)
    return -1;
  if (!S_ISLNK(st.st_mode)) {
    errno = EINVAL;
    return -1;
  }

  maxlen = st.st_size;

  /* According to readlink(2) lstat can report st_size == 0
     for some symlinks, such as those in /proc or /sys.  */
  if (maxlen == 0)
    maxlen = uv__fs_pathmax_size(req->path);
#else
  maxlen = uv__fs_pathmax_size(req->path);
#endif

  buf = uv__malloc(maxlen);

  if (buf == NULL) {
    errno = ENOMEM;
    return -1;
  }

#if defined(__MVS__)
  len = os390_readlink(req->path, buf, maxlen);
#else
  len = readlink(req->path, buf, maxlen);
#endif

  if (len == -1) {
    uv__free(buf);
    return -1;
  }

  /* Uncommon case: resize to make room for the trailing nul byte. */
  if (len == maxlen) {
    newbuf = uv__realloc(buf, len + 1);

    if (newbuf == NULL) {
      uv__free(buf);
      return -1;
    }

    buf = newbuf;
  }

  buf[len] = '\0';
  req->ptr = buf;

  return 0;
}